

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O0

int ec_seckey_export_der
              (secp256k1_context *ctx,uchar *seckey,size_t *seckeylen,uchar *key32,bool compressed)

{
  int iVar1;
  uchar (*in_RCX) [8];
  ulong *in_RDX;
  uchar (*in_RSI) [8];
  byte in_R8B;
  long in_FS_OFFSET;
  uchar *ptr_1;
  uchar *ptr;
  size_t pubkeylen;
  secp256k1_pubkey pubkey;
  int local_54;
  uint in_stack_ffffffffffffffcc;
  secp256k1_pubkey *in_stack_ffffffffffffffd0;
  size_t *in_stack_ffffffffffffffd8;
  uchar *in_stack_ffffffffffffffe0;
  secp256k1_context *in_stack_ffffffffffffffe8;
  secp256k1_pubkey *in_stack_fffffffffffffff0;
  secp256k1_context *ctx_00;
  
  ctx_00 = *(secp256k1_context **)(in_FS_OFFSET + 0x28);
  if (*in_RDX < 0x117) {
    __assert_fail("*seckeylen >= CKey::SIZE",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/key.cpp"
                  ,0x60,
                  "int ec_seckey_export_der(const secp256k1_context *, unsigned char *, size_t *, const unsigned char *, bool)"
                 );
  }
  iVar1 = secp256k1_ec_pubkey_create
                    (ctx_00,in_stack_fffffffffffffff0,(uchar *)in_stack_ffffffffffffffe8);
  if (iVar1 == 0) {
    *in_RDX = 0;
    local_54 = 0;
  }
  else {
    if ((in_R8B & 1) == 0) {
      *in_RSI = (uchar  [8])0x401010213018230;
      in_RSI[1][0] = ' ';
      *(uchar (*) [8])(in_RSI[1] + 1) = *in_RCX;
      *(uchar (*) [8])(in_RSI[2] + 1) = in_RCX[1];
      *(uchar (*) [8])(in_RSI[3] + 1) = in_RCX[2];
      *(uchar (*) [8])(in_RSI[4] + 1) = in_RCX[3];
      memcpy(in_RSI[5] + 1,
             ec_seckey_export_der(secp256k1_context_struct_const*,unsigned_char*,unsigned_long*,unsigned_char_const*,bool)
             ::middle,0xad);
      secp256k1_ec_pubkey_serialize
                (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                 in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      *in_RDX = 0x117;
      if (*in_RDX != 0x117) {
        __assert_fail("*seckeylen == CKey::SIZE",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/key.cpp"
                      ,0x98,
                      "int ec_seckey_export_der(const secp256k1_context *, unsigned char *, size_t *, const unsigned char *, bool)"
                     );
      }
    }
    else {
      *in_RSI = (uchar  [8])0x2004010102d38130;
      in_RSI[1] = *in_RCX;
      in_RSI[2] = in_RCX[1];
      in_RSI[3] = in_RCX[2];
      in_RSI[4] = in_RCX[3];
      memcpy(in_RSI + 5,ec_seckey_export_der::middle,0x8d);
      secp256k1_ec_pubkey_serialize
                (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                 in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      *in_RDX = 0xd6;
      if (*in_RDX != 0xd6) {
        __assert_fail("*seckeylen == CKey::COMPRESSED_SIZE",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/key.cpp"
                      ,0x7e,
                      "int ec_seckey_export_der(const secp256k1_context *, unsigned char *, size_t *, const unsigned char *, bool)"
                     );
      }
    }
    local_54 = 1;
  }
  if (*(secp256k1_context **)(in_FS_OFFSET + 0x28) != ctx_00) {
    __stack_chk_fail();
  }
  return local_54;
}

Assistant:

int ec_seckey_export_der(const secp256k1_context *ctx, unsigned char *seckey, size_t *seckeylen, const unsigned char *key32, bool compressed) {
    assert(*seckeylen >= CKey::SIZE);
    secp256k1_pubkey pubkey;
    size_t pubkeylen = 0;
    if (!secp256k1_ec_pubkey_create(ctx, &pubkey, key32)) {
        *seckeylen = 0;
        return 0;
    }
    if (compressed) {
        static const unsigned char begin[] = {
            0x30,0x81,0xD3,0x02,0x01,0x01,0x04,0x20
        };
        static const unsigned char middle[] = {
            0xA0,0x81,0x85,0x30,0x81,0x82,0x02,0x01,0x01,0x30,0x2C,0x06,0x07,0x2A,0x86,0x48,
            0xCE,0x3D,0x01,0x01,0x02,0x21,0x00,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,
            0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,
            0xFF,0xFF,0xFE,0xFF,0xFF,0xFC,0x2F,0x30,0x06,0x04,0x01,0x00,0x04,0x01,0x07,0x04,
            0x21,0x02,0x79,0xBE,0x66,0x7E,0xF9,0xDC,0xBB,0xAC,0x55,0xA0,0x62,0x95,0xCE,0x87,
            0x0B,0x07,0x02,0x9B,0xFC,0xDB,0x2D,0xCE,0x28,0xD9,0x59,0xF2,0x81,0x5B,0x16,0xF8,
            0x17,0x98,0x02,0x21,0x00,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,
            0xFF,0xFF,0xFF,0xFF,0xFE,0xBA,0xAE,0xDC,0xE6,0xAF,0x48,0xA0,0x3B,0xBF,0xD2,0x5E,
            0x8C,0xD0,0x36,0x41,0x41,0x02,0x01,0x01,0xA1,0x24,0x03,0x22,0x00
        };
        unsigned char *ptr = seckey;
        memcpy(ptr, begin, sizeof(begin)); ptr += sizeof(begin);
        memcpy(ptr, key32, 32); ptr += 32;
        memcpy(ptr, middle, sizeof(middle)); ptr += sizeof(middle);
        pubkeylen = CPubKey::COMPRESSED_SIZE;
        secp256k1_ec_pubkey_serialize(ctx, ptr, &pubkeylen, &pubkey, SECP256K1_EC_COMPRESSED);
        ptr += pubkeylen;
        *seckeylen = ptr - seckey;
        assert(*seckeylen == CKey::COMPRESSED_SIZE);
    } else {
        static const unsigned char begin[] = {
            0x30,0x82,0x01,0x13,0x02,0x01,0x01,0x04,0x20
        };
        static const unsigned char middle[] = {
            0xA0,0x81,0xA5,0x30,0x81,0xA2,0x02,0x01,0x01,0x30,0x2C,0x06,0x07,0x2A,0x86,0x48,
            0xCE,0x3D,0x01,0x01,0x02,0x21,0x00,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,
            0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,
            0xFF,0xFF,0xFE,0xFF,0xFF,0xFC,0x2F,0x30,0x06,0x04,0x01,0x00,0x04,0x01,0x07,0x04,
            0x41,0x04,0x79,0xBE,0x66,0x7E,0xF9,0xDC,0xBB,0xAC,0x55,0xA0,0x62,0x95,0xCE,0x87,
            0x0B,0x07,0x02,0x9B,0xFC,0xDB,0x2D,0xCE,0x28,0xD9,0x59,0xF2,0x81,0x5B,0x16,0xF8,
            0x17,0x98,0x48,0x3A,0xDA,0x77,0x26,0xA3,0xC4,0x65,0x5D,0xA4,0xFB,0xFC,0x0E,0x11,
            0x08,0xA8,0xFD,0x17,0xB4,0x48,0xA6,0x85,0x54,0x19,0x9C,0x47,0xD0,0x8F,0xFB,0x10,
            0xD4,0xB8,0x02,0x21,0x00,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,
            0xFF,0xFF,0xFF,0xFF,0xFE,0xBA,0xAE,0xDC,0xE6,0xAF,0x48,0xA0,0x3B,0xBF,0xD2,0x5E,
            0x8C,0xD0,0x36,0x41,0x41,0x02,0x01,0x01,0xA1,0x44,0x03,0x42,0x00
        };
        unsigned char *ptr = seckey;
        memcpy(ptr, begin, sizeof(begin)); ptr += sizeof(begin);
        memcpy(ptr, key32, 32); ptr += 32;
        memcpy(ptr, middle, sizeof(middle)); ptr += sizeof(middle);
        pubkeylen = CPubKey::SIZE;
        secp256k1_ec_pubkey_serialize(ctx, ptr, &pubkeylen, &pubkey, SECP256K1_EC_UNCOMPRESSED);
        ptr += pubkeylen;
        *seckeylen = ptr - seckey;
        assert(*seckeylen == CKey::SIZE);
    }
    return 1;
}